

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser15.cpp
# Opt level: O0

LibraryNodesLoader * __thiscall
COLLADASaxFWL::RootParser15::
beginCommonWithId<COLLADASaxFWL::LibraryNodesLoader,COLLADASaxFWL::LibraryNodesLoader15>
          (RootParser15 *this,char *id)

{
  _func_int **pp_Var1;
  LibraryNodesLoader *this_00;
  IParserImpl *parserImpl;
  LibraryNodesLoader *in_RDI;
  LibraryNodesLoader15 *loader15;
  LibraryNodesLoader *loader;
  IFilePartLoader *in_stack_ffffffffffffffa0;
  LibraryNodesLoader *in_stack_ffffffffffffffa8;
  LibraryNodesLoader15 *in_stack_ffffffffffffffb0;
  IParserImpl *pIVar2;
  IFilePartLoader *in_stack_ffffffffffffffb8;
  
  IFilePartLoader::deleteFilePartLoader(in_stack_ffffffffffffffa0);
  this_00 = (LibraryNodesLoader *)operator_new(0x128);
  LibraryNodesLoader::LibraryNodesLoader(in_RDI,in_stack_ffffffffffffffb8);
  parserImpl = (IParserImpl *)operator_new(0x28);
  LibraryNodesLoader15::LibraryNodesLoader15(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  IFilePartLoader::setParserImpl((IFilePartLoader *)this_00,parserImpl);
  IFilePartLoader::setPartLoader
            ((IFilePartLoader *)
             (in_RDI->super_NodeLoader).super_HelperLoaderBase._vptr_HelperLoaderBase,
             (IFilePartLoader *)this_00);
  pp_Var1 = (in_RDI->super_NodeLoader).super_HelperLoaderBase._vptr_HelperLoaderBase;
  pIVar2 = (IParserImpl *)0x0;
  if (parserImpl != (IParserImpl *)0x0) {
    pIVar2 = parserImpl + 1;
  }
  (**(code **)(*pp_Var1 + 0x50))(pp_Var1,pIVar2);
  DocumentProcessor::addToSidTree((DocumentProcessor *)this,id,(char *)loader);
  return this_00;
}

Assistant:

Loader* RootParser15::beginCommonWithId( const char * id)
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader15* loader15 = new Loader15(loader);
		loader->setParserImpl( loader15 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader15);
		mFileLoader->addToSidTree( id, 0);
		return loader;
	}